

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semicircle.hpp
# Opt level: O0

bool __thiscall
boost::geometry::model::
semicircle<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>::
intersects_point<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>
          (semicircle<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>
           *this,point<double,_2UL,_boost::geometry::cs::cartesian> *p)

{
  int iVar1;
  segment<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_> *geometry;
  geometry *this_00;
  longdouble in_ST0;
  type tVar2;
  bool local_31;
  point<double,_2UL,_boost::geometry::cs::cartesian> local_28;
  geometry *local_18;
  point<double,_2UL,_boost::geometry::cs::cartesian> *p_local;
  semicircle<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
  *this_local;
  
  local_18 = (geometry *)p;
  p_local = (point<double,_2UL,_boost::geometry::cs::cartesian> *)this;
  iVar1 = geometry::strategy::side::side_by_triangle<void>::
          apply<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>,boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>,boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>
                    ((point<double,_2UL,_boost::geometry::cs::cartesian> *)this,
                     (point<double,_2UL,_boost::geometry::cs::cartesian> *)(this + 0x10),p);
  local_31 = false;
  if (iVar1 == *(short *)(this + 0x20)) {
    local_28 = return_centroid<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>,boost::geometry::model::segment<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
                         ((segment<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                           *)this);
    this_00 = local_18;
    tVar2 = distance<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>,boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>
                      (&local_28,(point<double,_2UL,_boost::geometry::cs::cartesian> *)local_18);
    length<boost::geometry::model::segment<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
              ((type *)this,this_00,geometry);
    local_31 = (longdouble)tVar2 <= (longdouble)0.5 * in_ST0;
  }
  return local_31;
}

Assistant:

bool intersects_point(OtherPoint const &p) const
    {
        return strategy::side::side_by_triangle<>::apply(s.first, s.second, p) == side
        && geometry::distance(return_centroid<Point>(s), p) <= geometry::length(s) / 2;
    }